

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

uint nullcFindFunctionIndex(char *name)

{
  uint uVar1;
  uint uVar2;
  ExternFuncInfo *pEVar3;
  uint local_24;
  uint local_20;
  uint i;
  uint index;
  uint hash;
  char *name_local;
  
  if (NULLC::linker == 0) {
    NULLC::nullcLastError = "ERROR: NULLC cannot find linked code";
    name_local._4_4_ = 0xffffffff;
  }
  else if (name == (char *)0x0) {
    NULLC::nullcLastError = "ERROR: function name is \'null\'";
    name_local._4_4_ = 0xffffffff;
  }
  else {
    uVar1 = NULLC::GetStringHash(name);
    local_20 = 0xffffffff;
    for (local_24 = 0;
        uVar2 = FastVector<ExternFuncInfo,_false,_false>::size
                          ((FastVector<ExternFuncInfo,_false,_false> *)(NULLC::linker + 0x240)),
        local_24 < uVar2; local_24 = local_24 + 1) {
      pEVar3 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                         ((FastVector<ExternFuncInfo,_false,_false> *)(NULLC::linker + 0x240),
                          local_24);
      if ((pEVar3->isVisible != 0) &&
         (pEVar3 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                             ((FastVector<ExternFuncInfo,_false,_false> *)(NULLC::linker + 0x240),
                              local_24), pEVar3->nameHash == uVar1)) {
        if (local_20 != 0xffffffff) {
          NULLC::nullcLastError = "ERROR: there is more than one function with the same name";
          return 0xffffffff;
        }
        local_20 = local_24;
      }
    }
    if (local_20 == 0xffffffff) {
      NULLC::nullcLastError = "ERROR: function with such name cannot be found";
      name_local._4_4_ = 0xffffffff;
    }
    else {
      pEVar3 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                         ((FastVector<ExternFuncInfo,_false,_false> *)(NULLC::linker + 0x240),
                          local_20);
      if (pEVar3->funcCat == '\0') {
        name_local._4_4_ = local_20;
      }
      else {
        NULLC::nullcLastError = "ERROR: function uses context, which is unavailable";
        name_local._4_4_ = 0xffffffff;
      }
    }
  }
  return name_local._4_4_;
}

Assistant:

unsigned nullcFindFunctionIndex(const char* name)
{
	using namespace NULLC;

	if(!linker)
	{
		nullcLastError = "ERROR: NULLC cannot find linked code";
		return ~0u;
	}
	if(!name)
	{
		nullcLastError = "ERROR: function name is 'null'";
		return ~0u;
	}
	unsigned hash = GetStringHash(name);
	unsigned index = ~0u;
	for(unsigned i = 0; i < linker->exFunctions.size(); i++)
	{
		if(linker->exFunctions[i].isVisible && linker->exFunctions[i].nameHash == hash)
		{
			if(index != ~0u)
			{
				nullcLastError = "ERROR: there is more than one function with the same name";
				return ~0u;
			}
			index = i;
		}
	}
	if(index == ~0u)
	{
		nullcLastError = "ERROR: function with such name cannot be found";
		return ~0u;
	}
	if(linker->exFunctions[index].funcCat != ExternFuncInfo::NORMAL)
	{
		nullcLastError = "ERROR: function uses context, which is unavailable";
		return ~0u;
	}
	return index;
}